

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O0

vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> * __thiscall
winmd::reader::cache::nested_types(cache *this,TypeDef *enclosing_type)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  TypeDef *enclosing_type_local;
  cache *this_local;
  
  it._M_node = (_Base_ptr)enclosing_type;
  local_28._M_node =
       (_Base_ptr)
       cppwinrt::std::
       map<winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
       ::find(&this->m_nested_types,enclosing_type);
  local_30._M_node =
       (_Base_ptr)
       cppwinrt::std::
       map<winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
       ::end(&this->m_nested_types);
  bVar1 = cppwinrt::std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar3 = cppwinrt::std::
             _Rb_tree_const_iterator<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>
             ::operator->(&local_28);
    this_local = (cache *)&ppVar3->second;
  }
  else {
    if (nested_types(winmd::reader::TypeDef_const&)::empty == '\0') {
      iVar2 = __cxa_guard_acquire(&nested_types(winmd::reader::TypeDef_const&)::empty);
      if (iVar2 != 0) {
        cppwinrt::std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
        vector(&nested_types::empty);
        __cxa_atexit(cppwinrt::std::
                     vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
                     ~vector,&nested_types::empty,&__dso_handle);
        __cxa_guard_release(&nested_types(winmd::reader::TypeDef_const&)::empty);
      }
    }
    this_local = (cache *)&nested_types::empty;
  }
  return (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)this_local;
}

Assistant:

std::vector<TypeDef> const& nested_types(TypeDef const& enclosing_type) const
        {
            auto it = m_nested_types.find(enclosing_type);
            if (it != m_nested_types.end())
            {
                return it->second;
            }
            else
            {
                static const std::vector<TypeDef> empty;
                return empty;
            }
        }